

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  int *piVar3;
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  bool bVar7;
  parasail_result_t *ppVar8;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar9;
  int iVar10;
  ulong uVar11;
  undefined8 uVar12;
  bool bVar13;
  long lVar14;
  __m256i *palVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  __m256i *palVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong size;
  long lVar24;
  int iVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar27 [32];
  
  auVar41 = in_ZMM12._0_32_;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar1 = (profile->profile64).score;
    if (pvVar1 == (void *)0x0) {
      parasail_nw_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_nw_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_avx2_256_64_cold_4();
        }
        else {
          uVar20 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_avx2_256_64_cold_1();
          }
          else {
            uVar16 = uVar17 - 1;
            size = (ulong)uVar17 + 3 >> 2;
            iVar23 = -open;
            iVar10 = ppVar2->min;
            uVar21 = 0x8000000000000000 - (long)iVar10;
            if (iVar10 != iVar23 && SBORROW4(iVar10,iVar23) == iVar10 + open < 0) {
              uVar21 = CONCAT44(0,open) | 0x8000000000000000;
            }
            iVar10 = ppVar2->max;
            ppVar8 = parasail_result_new_table1((uint)((ulong)uVar17 + 3) & 0x7ffffffc,s2Len);
            if (ppVar8 != (parasail_result_t *)0x0) {
              iVar25 = (int)(uVar16 / size);
              ppVar8->flag = ppVar8->flag | 0x4820401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar9 = s2Len + -1;
                auVar29._8_4_ = open;
                auVar29._0_8_ = CONCAT44(0,open);
                auVar29._12_4_ = 0;
                auVar29._16_4_ = open;
                auVar29._20_4_ = 0;
                auVar29._24_4_ = open;
                auVar29._28_4_ = 0;
                auVar30._8_4_ = gap;
                auVar30._0_8_ = CONCAT44(0,gap);
                auVar30._12_4_ = 0;
                auVar30._16_4_ = gap;
                auVar30._20_4_ = 0;
                auVar30._24_4_ = gap;
                auVar30._28_4_ = 0;
                uVar21 = uVar21 + 1;
                lVar18 = 0x7ffffffffffffffe - (long)iVar10;
                auVar26._8_8_ = uVar21;
                auVar26._0_8_ = uVar21;
                auVar27._16_8_ = uVar21;
                auVar27._0_16_ = auVar26;
                auVar27._24_8_ = uVar21;
                iVar10 = (int)size;
                lVar14 = (long)-(gap * iVar10);
                auVar31._8_8_ = lVar14;
                auVar31._0_8_ = lVar14;
                auVar31._16_8_ = lVar14;
                auVar31._24_8_ = lVar14;
                auVar31 = vpblendd_avx2(auVar31,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                auVar31 = vpaddq_avx2(ZEXT832(uVar21),auVar31);
                lVar14 = (long)iVar23;
                auVar36._4_4_ = iVar10;
                auVar36._0_4_ = iVar10;
                auVar36._8_4_ = iVar10;
                auVar36._12_4_ = iVar10;
                auVar36._16_4_ = iVar10;
                auVar36._20_4_ = iVar10;
                auVar36._24_4_ = iVar10;
                auVar36._28_4_ = iVar10;
                auVar32._8_4_ = gap;
                auVar32._0_8_ = CONCAT44(0,gap);
                auVar32._12_4_ = 0;
                auVar32._16_4_ = gap;
                auVar32._20_4_ = 0;
                auVar32._24_4_ = gap;
                auVar32._28_4_ = 0;
                auVar34._8_8_ = lVar14;
                auVar34._0_8_ = lVar14;
                auVar34._16_8_ = lVar14;
                auVar34._24_8_ = lVar14;
                auVar36 = vpmuldq_avx2(auVar36,_DAT_00908b60);
                uVar11 = 0;
                palVar15 = ptr_02;
                palVar19 = ptr;
                do {
                  auVar38._8_8_ = uVar11;
                  auVar38._0_8_ = uVar11;
                  auVar38._16_8_ = uVar11;
                  auVar38._24_8_ = uVar11;
                  auVar38 = vpaddq_avx2(auVar36,auVar38);
                  auVar39 = vpmuludq_avx2(auVar38,auVar32);
                  auVar38 = vpsrlq_avx2(auVar38,0x20);
                  auVar38 = vpmuludq_avx2(auVar38,auVar32);
                  auVar38 = vpsllq_avx2(auVar38,0x20);
                  auVar38 = vpaddq_avx2(auVar39,auVar38);
                  alVar5 = (__m256i)vpsubq_avx2(auVar34,auVar38);
                  alVar6 = (__m256i)vpsubq_avx2((undefined1  [32])alVar5,auVar29);
                  *palVar15 = alVar5;
                  *palVar19 = alVar6;
                  uVar11 = uVar11 + 1;
                  palVar19 = palVar19 + 1;
                  palVar15 = palVar15 + 1;
                } while (size != uVar11);
                *ptr_00 = 0;
                lVar14 = uVar20 - 1;
                auVar40._8_8_ = lVar14;
                auVar40._0_8_ = lVar14;
                auVar40._16_8_ = lVar14;
                auVar40._24_8_ = lVar14;
                auVar36 = vpmovsxbq_avx2(ZEXT416(0x4030201));
                uVar11 = 0;
                auVar38 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                auVar39._8_8_ = 0x8000000000000000;
                auVar39._0_8_ = 0x8000000000000000;
                auVar39._16_8_ = 0x8000000000000000;
                auVar39._24_8_ = 0x8000000000000000;
                auVar41 = vpcmpeqd_avx2(auVar41,auVar41);
                auVar42._8_8_ = 4;
                auVar42._0_8_ = 4;
                auVar42._16_8_ = 4;
                auVar42._24_8_ = 4;
                do {
                  auVar43._8_8_ = uVar11;
                  auVar43._0_8_ = uVar11;
                  auVar43._16_8_ = uVar11;
                  auVar43._24_8_ = uVar11;
                  auVar43 = vpor_avx2(auVar43,auVar38);
                  auVar37 = vpcmpgtq_avx2(auVar43 ^ auVar39,auVar40 ^ auVar39);
                  auVar43 = vpaddq_avx2(auVar36,auVar41);
                  auVar4 = vpmuludq_avx2(auVar43,auVar32);
                  auVar43 = vpsrlq_avx2(auVar43,0x20);
                  auVar43 = vpmuludq_avx2(auVar43,auVar32);
                  auVar43 = vpsllq_avx2(auVar43,0x20);
                  auVar43 = vpaddq_avx2(auVar43,auVar4);
                  auVar43 = vpsubq_avx2(auVar34,auVar43);
                  auVar43 = vpmaskmovq_avx2(auVar37 ^ auVar41,auVar43);
                  *(undefined1 (*) [32])(ptr_00 + uVar11 + 1) = auVar43;
                  uVar11 = uVar11 + 4;
                  auVar36 = vpaddq_avx2(auVar36,auVar42);
                } while ((s2Len + 3U & 0xfffffffc) != uVar11);
                alVar5 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                palVar15 = ptr_03 + (iVar10 - 1U);
                uVar11 = size;
                do {
                  *palVar15 = alVar5;
                  alVar5 = (__m256i)vpsubq_avx2((undefined1  [32])alVar5,auVar30);
                  palVar15 = palVar15 + -1;
                  iVar23 = (int)uVar11;
                  uVar17 = iVar23 - 1;
                  uVar11 = (ulong)uVar17;
                } while (uVar17 != 0 && 0 < iVar23);
                lVar22 = size * uVar20;
                lVar14 = 0;
                uVar11 = 0;
                auVar33 = ZEXT3264(auVar27);
                auVar41._8_8_ = lVar18;
                auVar41._0_8_ = lVar18;
                auVar41._16_8_ = lVar18;
                auVar41._24_8_ = lVar18;
                auVar35 = ZEXT3264(auVar41);
                do {
                  auVar28 = SUB3216(ptr_02[iVar10 - 1U],0);
                  auVar37._0_16_ = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar26;
                  auVar37._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar28;
                  auVar36 = vpalignr_avx2((undefined1  [32])ptr_02[iVar10 - 1U],auVar37,8);
                  auVar36 = vpblendd_avx2(auVar36,ZEXT832((ulong)ptr_00[uVar11]),3);
                  iVar23 = ppVar2->mapper[(byte)s2[uVar11]];
                  auVar34 = vpsubq_avx2(auVar27,(undefined1  [32])*ptr_03);
                  lVar18 = 0;
                  auVar32 = auVar27;
                  do {
                    auVar39 = vpaddq_avx2(auVar36,*(undefined1 (*) [32])
                                                   ((long)pvVar1 +
                                                   lVar18 + (long)iVar23 * size * 0x20));
                    auVar36 = *(undefined1 (*) [32])((long)*ptr_02 + lVar18);
                    auVar40 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar18),auVar30);
                    auVar34 = vpaddq_avx2(auVar34,*(undefined1 (*) [32])((long)*ptr_03 + lVar18));
                    auVar42 = vpsubq_avx2(auVar36,auVar29);
                    auVar38 = vpcmpgtq_avx2(auVar32,auVar34);
                    auVar32 = vblendvpd_avx(auVar34,auVar32,auVar38);
                    auVar34 = vpcmpgtq_avx2(auVar40,auVar42);
                    auVar38 = vblendvpd_avx(auVar42,auVar40,auVar34);
                    auVar34 = vpcmpgtq_avx2(auVar38,auVar39);
                    auVar34 = vblendvpd_avx(auVar39,auVar38,auVar34);
                    *(undefined1 (*) [32])((long)*ptr + lVar18) = auVar38;
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar18) = auVar34;
                    lVar18 = lVar18 + 0x20;
                  } while (size << 5 != lVar18);
                  auVar38 = vpermpd_avx2(auVar34,0x90);
                  lVar18 = uVar11 + 1;
                  uVar11 = uVar11 + 1;
                  auVar36 = vblendpd_avx(auVar38,ZEXT832((ulong)ptr_00[lVar18]),1);
                  auVar36 = vpaddq_avx2(auVar36,(undefined1  [32])*ptr_03);
                  auVar34 = vpcmpgtq_avx2(auVar32,auVar36);
                  auVar36 = vblendvpd_avx(auVar36,auVar32,auVar34);
                  bVar7 = true;
                  do {
                    bVar13 = bVar7;
                    auVar32 = vperm2f128_avx(auVar36,auVar36,8);
                    auVar32 = vpalignr_avx2(auVar36,auVar32,8);
                    auVar32 = vpaddq_avx2(auVar31,auVar32);
                    auVar34 = vpcmpgtq_avx2(auVar36,auVar32);
                    auVar36 = vblendvpd_avx(auVar32,auVar36,auVar34);
                    bVar7 = false;
                  } while (bVar13);
                  auVar32 = vperm2f128_avx(auVar36,auVar36,8);
                  auVar36 = vpalignr_avx2(auVar36,auVar32,8);
                  auVar32 = vpaddq_avx2(ZEXT832(uVar21),auVar36);
                  auVar36 = vblendpd_avx(auVar38,ZEXT832((ulong)ptr_00[lVar18]),1);
                  auVar34 = vpcmpgtq_avx2(auVar36,auVar32);
                  auVar36 = vblendvpd_avx(auVar32,auVar36,auVar34);
                  lVar24 = 0;
                  lVar18 = lVar14;
                  do {
                    auVar32 = vpsubq_avx2(auVar32,auVar30);
                    auVar34 = vpsubq_avx2(auVar36,auVar29);
                    auVar36 = vpcmpgtq_avx2(auVar32,auVar34);
                    auVar32 = vblendvpd_avx(auVar34,auVar32,auVar36);
                    auVar36 = *(undefined1 (*) [32])((long)*ptr_01 + lVar24);
                    auVar34 = vpcmpgtq_avx2(auVar36,auVar32);
                    auVar36 = vblendvpd_avx(auVar32,auVar36,auVar34);
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar24) = auVar36;
                    auVar34 = vpcmpgtq_avx2(auVar36,auVar35._0_32_);
                    auVar34 = vblendvpd_avx(auVar36,auVar35._0_32_,auVar34);
                    auVar35 = ZEXT3264(auVar34);
                    auVar38 = vpcmpgtq_avx2(auVar33._0_32_,auVar36);
                    auVar38 = vblendvpd_avx(auVar36,auVar33._0_32_,auVar38);
                    auVar33 = ZEXT3264(auVar38);
                    piVar3 = ((ppVar8->field_4).rowcols)->score_row;
                    *(int *)((long)piVar3 + lVar18) = auVar36._0_4_;
                    *(int *)((long)piVar3 + lVar22 * 4 + lVar18) = auVar36._8_4_;
                    *(int *)((long)piVar3 + lVar22 * 8 + lVar18) = auVar36._16_4_;
                    *(int *)((long)piVar3 + lVar22 * 0xc + lVar18) = auVar36._24_4_;
                    lVar24 = lVar24 + 0x20;
                    lVar18 = lVar18 + uVar20 * 4;
                  } while (size << 5 != lVar24);
                  lVar14 = lVar14 + 4;
                } while (uVar11 != uVar20);
                alVar5 = ptr_02[(ulong)uVar16 % size];
                auVar26 = alVar5._16_16_;
                if (iVar25 < 3) {
                  iVar10 = 0;
                  do {
                    auVar31 = vperm2i128_avx2((undefined1  [32])alVar5,(undefined1  [32])alVar5,8);
                    alVar5 = (__m256i)vpalignr_avx2((undefined1  [32])alVar5,auVar31,8);
                    auVar26 = alVar5._16_16_;
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < 3 - iVar25);
                }
                auVar31 = vpcmpgtq_avx2(auVar27,auVar34);
                auVar41 = vpcmpgtq_avx2(auVar38,auVar41);
                auVar41 = vpor_avx2(auVar41,auVar31);
                if ((((auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     SUB321(auVar41 >> 0x7f,0) == '\0') && SUB321(auVar41 >> 0xbf,0) == '\0') &&
                    -1 < auVar41[0x1f]) {
                  uVar12 = vpextrq_avx(auVar26,1);
                  iVar10 = (int)uVar12;
                }
                else {
                  *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                  iVar10 = 0;
                  iVar9 = 0;
                  uVar16 = 0;
                }
                ppVar8->score = iVar10;
                ppVar8->end_query = uVar16;
                ppVar8->end_ref = iVar9;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar8;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}